

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

bool __thiscall
jsoncons::typed_array_visitor<std::vector<double,_std::allocator<double>_>_>::visit_uint64
          (typed_array_visitor<std::vector<double,_std::allocator<double>_>_> *this,uint64_t value,
          semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  undefined1 auVar1 [16];
  double local_8;
  
  auVar1._8_4_ = (int)(value >> 0x20);
  auVar1._0_8_ = value;
  auVar1._12_4_ = 0x45300000;
  local_8 = (auVar1._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)value) - 4503599627370496.0);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this->v_,&local_8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, 
            semantic_tag, 
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }